

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.cpp
# Opt level: O0

Formula * __thiscall
FMB::FiniteModelMultiSorted::partialEvaluate(FiniteModelMultiSorted *this,Formula *formula)

{
  bool bVar1;
  Connective CVar2;
  string *psVar3;
  FiniteModelMultiSorted *in_RSI;
  Formula *newInner;
  Formula *inner_1;
  VList *vs;
  Formula *newRight;
  Formula *newLeft;
  Formula *right;
  Formula *left;
  Formula *newArg;
  Iterator fit;
  FormulaList *newArgs;
  FormulaList *args;
  Formula *inner;
  Literal *in_stack_00000130;
  bool evaluated;
  Literal *lit;
  Formula *in_stack_00000358;
  Formula *in_stack_fffffffffffffea8;
  UserErrorException *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  Connective in_stack_fffffffffffffebc;
  JunctionFormula *in_stack_fffffffffffffec0;
  Connective in_stack_fffffffffffffecc;
  QuantifiedFormula *in_stack_fffffffffffffed0;
  FiniteModelMultiSorted *local_118;
  Iterator local_58;
  undefined8 local_50;
  FormulaList *local_48;
  Formula *local_30;
  undefined1 local_21;
  Formula *in_stack_ffffffffffffffe0;
  FiniteModelMultiSorted *local_8;
  
  CVar2 = Kernel::Formula::connective((Formula *)in_RSI);
  switch(CVar2) {
  case LITERAL:
    Kernel::Formula::literal((Formula *)0x2d9913);
    bVar1 = Kernel::Term::ground((Term *)0x2d9928);
    local_8 = in_RSI;
    if (bVar1) {
      local_21 = evaluateGroundLiteral((FiniteModelMultiSorted *)lit,in_stack_00000130);
      if ((bool)local_21) {
        local_118 = (FiniteModelMultiSorted *)Kernel::Formula::trueFormula();
      }
      else {
        local_118 = (FiniteModelMultiSorted *)Kernel::Formula::falseFormula();
      }
      local_8 = local_118;
    }
    break;
  case AND:
  case OR:
    local_48 = Kernel::Formula::args((Formula *)0x2d9a30);
    local_50 = 0;
    Lib::List<Kernel::Formula_*>::Iterator::Iterator(&local_58,local_48);
    while (bVar1 = Lib::List<Kernel::Formula_*>::Iterator::hasNext((Iterator *)0x2d9a66), bVar1) {
      Lib::List<Kernel::Formula_*>::Iterator::next((Iterator *)in_stack_fffffffffffffeb0);
      partialEvaluate(in_RSI,in_stack_ffffffffffffffe0);
      Lib::List<Kernel::Formula_*>::push
                ((Formula *)in_stack_fffffffffffffeb0,
                 (List<Kernel::Formula_*> **)in_stack_fffffffffffffea8);
    }
    local_8 = (FiniteModelMultiSorted *)Kernel::JunctionFormula::operator_new(0x2d9aaf);
    Kernel::Formula::connective((Formula *)in_RSI);
    Kernel::JunctionFormula::JunctionFormula
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
               (FormulaList *)in_stack_fffffffffffffeb0);
    break;
  case IMP:
  case IFF:
  case XOR:
    Kernel::Formula::left((Formula *)0x2d9b26);
    Kernel::Formula::right((Formula *)0x2d9b3b);
    partialEvaluate(in_RSI,in_stack_ffffffffffffffe0);
    partialEvaluate(in_RSI,in_stack_ffffffffffffffe0);
    local_8 = (FiniteModelMultiSorted *)Kernel::BinaryFormula::operator_new(0x2d9b81);
    Kernel::Formula::connective((Formula *)in_RSI);
    Kernel::BinaryFormula::BinaryFormula
              ((BinaryFormula *)local_8,in_stack_fffffffffffffebc,
               (Formula *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    break;
  case NOT:
    Kernel::Formula::uarg((Formula *)0x2d99b0);
    local_30 = partialEvaluate(in_RSI,in_stack_ffffffffffffffe0);
    local_8 = (FiniteModelMultiSorted *)Kernel::NegatedFormula::operator_new(0x2d99cf);
    Kernel::NegatedFormula::NegatedFormula
              ((NegatedFormula *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    break;
  case FORALL:
  case EXISTS:
    Kernel::Formula::vars((Formula *)0x2d9c00);
    Kernel::Formula::qarg((Formula *)0x2d9c15);
    partialEvaluate(in_RSI,in_stack_ffffffffffffffe0);
    local_8 = (FiniteModelMultiSorted *)Kernel::QuantifiedFormula::operator_new(0x2d9c41);
    CVar2 = Kernel::Formula::connective((Formula *)in_RSI);
    Kernel::QuantifiedFormula::QuantifiedFormula
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
               (VList *)in_stack_fffffffffffffec0,(SList *)CONCAT44(CVar2,in_stack_fffffffffffffeb8)
               ,(Formula *)local_8);
    break;
  default:
    psVar3 = (string *)__cxa_allocate_exception(0x50);
    Kernel::Formula::toString_abi_cxx11_(in_stack_00000358);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffeb0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                   (char *)in_stack_fffffffffffffeb0);
    Lib::UserErrorException::Exception(in_stack_fffffffffffffeb0,psVar3);
    __cxa_throw(psVar3,&Lib::UserErrorException::typeinfo,
                Lib::UserErrorException::~UserErrorException);
  case FALSE:
  case TRUE:
    local_8 = in_RSI;
  }
  return (Formula *)local_8;
}

Assistant:

Formula* FiniteModelMultiSorted::partialEvaluate(Formula* formula)
    {
#if DEBUG_MODEL
        for(unsigned i=0;i<depth;i++){ cout << "."; }
        cout << "Evaluating..." << formula->toString() << endl;
#endif
        
        switch(formula->connective()){
                case LITERAL:
            {
                Literal* lit = formula->literal();
                if(!lit->ground()){
                    return formula;
                }
                bool evaluated = evaluateGroundLiteral(lit);
                return evaluated ? Formula::trueFormula() : Formula::falseFormula(); 
            }
                
                case FALSE:
                case TRUE:
                    return formula;
                case NOT:
                {
                  Formula* inner = partialEvaluate(formula->uarg());
                  return new NegatedFormula(inner);
                }
                case AND:
                case OR:
            {
                FormulaList* args = formula->args();
                FormulaList* newArgs = 0;
                FormulaList::Iterator fit(args);
                while(fit.hasNext()){
                    Formula* newArg = partialEvaluate(fit.next());
                    FormulaList::push(newArg,newArgs);
                }
                return new JunctionFormula(formula->connective(),newArgs); 
            }
                
                case IMP:
                case XOR:
                case IFF:
            {
                Formula* left = formula->left();
                Formula* right = formula->right();
                Formula* newLeft = partialEvaluate(left);
                Formula* newRight = partialEvaluate(right);
                
                return new BinaryFormula(formula->connective(),newLeft,newRight); 
            }
                
                case FORALL:
                case EXISTS:
            {
                VList* vs = formula->vars();
                Formula* inner  = formula->qarg();
                Formula* newInner = partialEvaluate(inner);
                return new QuantifiedFormula(formula->connective(),vs,0,newInner);
            }
            default:
                USER_ERROR("Cannot evaluate " + formula->toString() + ", not supported");
        }

        NOT_IMPLEMENTED;
        return 0;
    }